

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate_foreach_macro.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int max_iteration;
  ostream *poVar1;
  
  max_iteration = 0x400;
  if (1 < argc) {
    max_iteration = atoi(argv[1]);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"#ifndef ",8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"MSERIALIZE_DETAIL_FOREACH_HPP",0x1d);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"#define ",8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"MSERIALIZE_DETAIL_FOREACH_HPP",0x1d);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"// Generated by GenerateForeachMacro ",0x25);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,max_iteration);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  write_count((ostream *)&std::cout,max_iteration + 1);
  write_foreach((ostream *)&std::cout,max_iteration);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n#endif // ",0xb);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"MSERIALIZE_DETAIL_FOREACH_HPP",0x1d);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  return 0;
}

Assistant:

int main(int argc, const char* argv[])
{
  /** The max number of arguments FOREACH will call F */
  const int max_iteration = (argc >= 2) ? std::atoi(argv[1]) : 1024; // NOLINT

  std::cout << "#ifndef " << header_guard << "\n"
            << "#define " << header_guard << "\n\n";

  std::cout << "// Generated by GenerateForeachMacro " << max_iteration << "\n";

  write_count(std::cout, max_iteration+1);
  write_foreach(std::cout, max_iteration);

  std::cout << "\n#endif // " << header_guard << "\n";
}